

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O3

complex<float> * __thiscall
TPZFMatrix<std::complex<float>_>::operator()
          (TPZFMatrix<std::complex<float>_> *this,int64_t row,int64_t col)

{
  long lVar1;
  
  lVar1 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  if (((-1 < row && row < lVar1) && (-1 < col)) &&
     (col < (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol)) {
    return this->fElem + lVar1 * col + row;
  }
  Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

inline TVar &TPZFMatrix<TVar>::operator()( const int64_t row, const int64_t col) {
#ifndef PZNODEBUG
    if(row >=  this->Rows() || row<0 || col >=  this->Cols() || col<0) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        DebugStop();
    }
#endif
    return *(this->fElem+col*this->fRow+row);
}